

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void * __thiscall rlist::listSearchKey(rlist *this,void *value)

{
  int iVar1;
  listNode *ptr;
  rlist *this_00;
  
  ptr = this->rl->head;
  if (ptr != (listNode *)0x0) {
    this->view = ptr;
    this_00 = this;
    do {
      iVar1 = match(this_00,ptr,value);
      if (iVar1 != 0) {
        return ptr;
      }
      ptr = ptr->next;
      this->view = ptr;
    } while (ptr != (listNode *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void * rlist::listSearchKey(void *value){
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=NULL){
            if(rlist::match(view,value))
                return view;
            view=view->next;
        }
    }
    return NULL;
}